

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O3

void __thiscall
uWS::HttpContext<false>::onHttp
          (HttpContext<false> *this,string *method,string *pattern,
          unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *handler,bool upgrade)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  uint32_t priority;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  undefined1 local_c9;
  type local_c8;
  vtable<fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  data_accessor local_58 [2];
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
  local_48;
  
  lVar3 = us_socket_context_ext(0,this);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = std::__cxx11::string::compare((char *)method);
  if (iVar2 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_a8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(lVar3 + 0x18));
  }
  else {
    pcVar1 = (method->_M_dataplus)._M_p;
    local_c8.accessor_ = (data_accessor)&local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + method->_M_string_length);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               &local_c8,&local_a8);
    if (local_c8.accessor_.ptr_ != (data_accessor)&local_b8) {
      operator_delete((void *)local_c8.accessor_,(ulong)(local_b8.cmd_ + 1));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,&local_a8);
  pcVar1 = (pattern->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + pattern->_M_string_length);
  (*(handler->erasure_).vtable_.cmd_)(&local_48,op_move,(data_accessor *)handler,0x10,local_58,0x10)
  ;
  (handler->erasure_).vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>::empty_invoker<true>::
       invoke;
  (handler->erasure_).vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
       ::empty_cmd;
  fu2::abi_400::detail::type_erasure::
  erasure<true,fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>*)>>
  ::
  erasure<uWS::HttpContext<false>::onHttp(std::__cxx11::string,std::__cxx11::string,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::HttpResponse<false>*,uWS::HttpRequest*)>>&&,bool)::_lambda(auto:1*)_1_,std::allocator<uWS::HttpContext<false>::onHttp(std::__cxx11::string,std::__cxx11::string,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::HttpResponse<false>*,uWS::HttpRequest*)>>&&,bool)::_lambda(auto:1*)_1_>>
            ((erasure<true,fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>*)>>
              *)&local_c8,local_58,&local_c9);
  iVar2 = std::__cxx11::string::compare((char *)method);
  priority = 0xf0000000;
  if (iVar2 != 0) {
    priority = (uint)!upgrade * 0x10000000 + 0xd0000000;
  }
  HttpRouter<uWS::HttpContextData<false>::RouterData>::add
            ((HttpRouter<uWS::HttpContextData<false>::RouterData> *)(lVar3 + 0x18),&local_70,
             &local_90,(unique_function<bool_(HttpRouter<RouterData>_*)> *)&local_c8,priority);
  (*local_b8.cmd_)(&local_b8,op_weak_destroy,&local_c8.accessor_,0x10,(data_accessor *)0x0,0);
  (*local_48.cmd_)(&local_48,op_weak_destroy,local_58,0x10,(data_accessor *)0x0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void onHttp(std::string method, std::string pattern, fu2::unique_function<void(HttpResponse<SSL> *, HttpRequest *)> &&handler, bool upgrade = false) {
        HttpContextData<SSL> *httpContextData = getSocketContextData();

        /* Todo: This is ugly, fix */
        std::vector<std::string> methods;
        if (method == "*") {
            methods = httpContextData->router.methods;
        } else {
            methods = {method};
        }

        httpContextData->router.add(methods, pattern, [handler = std::move(handler)](auto *r) mutable {
            auto user = r->getUserData();
            user.httpRequest->setYield(false);
            user.httpRequest->setParameters(r->getParameters());

            /* Middleware? Automatically respond to expectations */
            std::string_view expect = user.httpRequest->getHeader("expect");
            if (expect.length() && expect == "100-continue") {
                user.httpResponse->writeContinue();
            }

            handler(user.httpResponse, user.httpRequest);

            /* If any handler yielded, the router will keep looking for a suitable handler. */
            if (user.httpRequest->getYield()) {
                return false;
            }
            return true;
        }, method == "*" ? httpContextData->router.LOW_PRIORITY : (upgrade ? httpContextData->router.HIGH_PRIORITY : httpContextData->router.MEDIUM_PRIORITY));
    }